

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O2

void __thiscall DBSQLite::DBSQLite(DBSQLite *this,char *dbFile)

{
  int iVar1;
  
  (this->super_DB)._vptr_DB = (_func_int **)&PTR_fetchTLEs_00119b60;
  iVar1 = sqlite3_open(dbFile,&this->_sql);
  if (iVar1 != 0) {
    return;
  }
  sqlite3_exec(this->_sql,
               "CREATE TABLE IF NOT EXISTS tle (timestamp TIMESTAMP DEFAULT CURRENT_TIMESTAMP, norad INT PRIMARY KEY, name TEXT, line1 TEXT, line2 TEXT)"
               ,0,0,0);
  return;
}

Assistant:

DBSQLite::DBSQLite(const char *dbFile) {
  // Open DB and if not a failure, then setup the table data.
  if (!sqlite3_open(dbFile, &_sql)) {
    const char *q = "CREATE TABLE IF NOT EXISTS tle "
                    "(timestamp TIMESTAMP DEFAULT CURRENT_TIMESTAMP, "
                    "norad INT PRIMARY KEY, "
                    "name TEXT, line1 TEXT, line2 TEXT)";
    sqlite3_exec(_sql, q, nullptr, nullptr, nullptr);
  }
}